

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.c
# Opt level: O0

void gdImageLine(gdImagePtr im,int x1,int y1,int x2,int y2,int color)

{
  int iVar1;
  int iVar2;
  int iVar3;
  double dVar4;
  double as;
  double ac;
  int thick;
  int wstart;
  int w;
  int wid;
  int ydirflag;
  int xdirflag;
  int yend;
  int xend;
  int y;
  int x;
  int d;
  int incr2;
  int incr1;
  int dy;
  int dx;
  int color_local;
  int y2_local;
  int x2_local;
  int y1_local;
  int x1_local;
  gdImagePtr im_local;
  
  dx = y2;
  color_local = x2;
  y2_local = y1;
  x2_local = x1;
  _y1_local = im;
  if (color == -7) {
    gdImageAALine(im,x1,y1,x2,y2,im->AA_color);
  }
  else {
    iVar1 = clip_1d(&x2_local,&y2_local,&color_local,&dx,im->cx1,im->cx2);
    if ((iVar1 != 0) &&
       (iVar1 = clip_1d(&y2_local,&x2_local,&dx,&color_local,_y1_local->cy1,_y1_local->cy2),
       iVar1 != 0)) {
      iVar1 = _y1_local->thick;
      iVar2 = color_local - x2_local;
      if (iVar2 < 1) {
        iVar2 = -iVar2;
      }
      iVar3 = dx - y2_local;
      if (iVar3 < 1) {
        iVar3 = -iVar3;
      }
      if (iVar2 == 0) {
        gdImageVLine(_y1_local,x2_local,y2_local,dx,color);
      }
      else if (iVar3 == 0) {
        gdImageHLine(_y1_local,y2_local,x2_local,color_local,color);
      }
      else if (iVar2 < iVar3) {
        dVar4 = atan2((double)iVar3,(double)iVar2);
        dVar4 = sin(dVar4);
        if ((dVar4 != 0.0) || (NAN(dVar4))) {
          wstart = (int)((double)iVar1 / dVar4);
        }
        else {
          wstart = 1;
        }
        if (wstart == 0) {
          wstart = 1;
        }
        y = iVar2 * 2 - iVar3;
        iVar1 = (iVar2 - iVar3) * 2;
        if (dx < y2_local) {
          yend = dx;
          xend = color_local;
          ydirflag = y2_local;
          wid = -1;
        }
        else {
          yend = y2_local;
          xend = x2_local;
          ydirflag = dx;
          wid = 1;
        }
        iVar3 = xend - wstart / 2;
        for (thick = iVar3; thick < iVar3 + wstart; thick = thick + 1) {
          gdImageSetPixel(_y1_local,thick,yend,color);
        }
        if ((color_local - x2_local) * wid < 1) {
          while (yend < ydirflag) {
            yend = yend + 1;
            iVar3 = iVar2 * 2;
            if (-1 < y) {
              xend = xend + -1;
              iVar3 = iVar1;
            }
            y = iVar3 + y;
            iVar3 = xend - wstart / 2;
            for (thick = iVar3; thick < iVar3 + wstart; thick = thick + 1) {
              gdImageSetPixel(_y1_local,thick,yend,color);
            }
          }
        }
        else {
          while (yend < ydirflag) {
            yend = yend + 1;
            iVar3 = iVar2 * 2;
            if (-1 < y) {
              xend = xend + 1;
              iVar3 = iVar1;
            }
            y = iVar3 + y;
            iVar3 = xend - wstart / 2;
            for (thick = iVar3; thick < iVar3 + wstart; thick = thick + 1) {
              gdImageSetPixel(_y1_local,thick,yend,color);
            }
          }
        }
      }
      else {
        dVar4 = atan2((double)iVar3,(double)iVar2);
        dVar4 = cos(dVar4);
        if ((dVar4 != 0.0) || (NAN(dVar4))) {
          wstart = (int)((double)iVar1 / dVar4);
        }
        else {
          wstart = 1;
        }
        if (wstart == 0) {
          wstart = 1;
        }
        y = iVar3 * 2 - iVar2;
        iVar1 = (iVar3 - iVar2) * 2;
        if (color_local < x2_local) {
          xend = color_local;
          yend = dx;
          w = -1;
          xdirflag = x2_local;
        }
        else {
          xend = x2_local;
          yend = y2_local;
          w = 1;
          xdirflag = color_local;
        }
        iVar2 = yend - wstart / 2;
        for (thick = iVar2; thick < iVar2 + wstart; thick = thick + 1) {
          gdImageSetPixel(_y1_local,xend,thick,color);
        }
        if ((dx - y2_local) * w < 1) {
          while (xend < xdirflag) {
            xend = xend + 1;
            iVar2 = iVar3 * 2;
            if (-1 < y) {
              yend = yend + -1;
              iVar2 = iVar1;
            }
            y = iVar2 + y;
            iVar2 = yend - wstart / 2;
            for (thick = iVar2; thick < iVar2 + wstart; thick = thick + 1) {
              gdImageSetPixel(_y1_local,xend,thick,color);
            }
          }
        }
        else {
          while (xend < xdirflag) {
            xend = xend + 1;
            iVar2 = iVar3 * 2;
            if (-1 < y) {
              yend = yend + 1;
              iVar2 = iVar1;
            }
            y = iVar2 + y;
            iVar2 = yend - wstart / 2;
            for (thick = iVar2; thick < iVar2 + wstart; thick = thick + 1) {
              gdImageSetPixel(_y1_local,xend,thick,color);
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

BGD_DECLARE(void) gdImageLine (gdImagePtr im, int x1, int y1, int x2, int y2, int color)
{
	int dx, dy, incr1, incr2, d, x, y, xend, yend, xdirflag, ydirflag;
	int wid;
	int w, wstart;
	int thick;

	if (color == gdAntiAliased) {
		/*
		  gdAntiAliased passed as color: use the much faster, much cheaper
		  and equally attractive gdImageAALine implementation. That
		  clips too, so don't clip twice.
		*/
		gdImageAALine(im, x1, y1, x2, y2, im->AA_color);
		return;
	}
	/* 2.0.10: Nick Atty: clip to edges of drawing rectangle, return if no
	   points need to be drawn. 2.0.26, TBB: clip to edges of clipping
	   rectangle. We were getting away with this because gdImageSetPixel
	   is used for actual drawing, but this is still more efficient and opens
	   the way to skip per-pixel bounds checking in the future. */

	if (clip_1d (&x1, &y1, &x2, &y2, im->cx1, im->cx2) == 0)
		return;
	if (clip_1d (&y1, &x1, &y2, &x2, im->cy1, im->cy2) == 0)
		return;
	thick = im->thick;

	dx = abs (x2 - x1);
	dy = abs (y2 - y1);

	if (dx == 0) {
		gdImageVLine(im, x1, y1, y2, color);
		return;
	} else if (dy == 0) {
		gdImageHLine(im, y1, x1, x2, color);
		return;
	}

	if (dy <= dx) {
		/* More-or-less horizontal. use wid for vertical stroke */
		/* Doug Claar: watch out for NaN in atan2 (2.0.5) */
		
		/* 2.0.12: Michael Schwartz: divide rather than multiply;
			  TBB: but watch out for /0! */
		double ac = cos (atan2 (dy, dx));
		if (ac != 0) {
			wid = thick / ac;
		} else {
			wid = 1;
		}
		if (wid == 0) {
			wid = 1;
		}
		d = 2 * dy - dx;
		incr1 = 2 * dy;
		incr2 = 2 * (dy - dx);
		if (x1 > x2) {
			x = x2;
			y = y2;
			ydirflag = (-1);
			xend = x1;
		} else {
			x = x1;
			y = y1;
			ydirflag = 1;
			xend = x2;
		}

		/* Set up line thickness */
		wstart = y - wid / 2;
		for (w = wstart; w < wstart + wid; w++)
			gdImageSetPixel (im, x, w, color);

		if (((y2 - y1) * ydirflag) > 0) {
			while (x < xend) {
				x++;
				if (d < 0) {
					d += incr1;
				} else {
					y++;
					d += incr2;
				}
				wstart = y - wid / 2;
				for (w = wstart; w < wstart + wid; w++)
					gdImageSetPixel (im, x, w, color);
			}
		} else {
			while (x < xend) {
				x++;
				if (d < 0) {
					d += incr1;
				} else {
					y--;
					d += incr2;
				}
				wstart = y - wid / 2;
				for (w = wstart; w < wstart + wid; w++)
					gdImageSetPixel (im, x, w, color);
			}
		}
	} else {
		/* More-or-less vertical. use wid for horizontal stroke */
		/* 2.0.12: Michael Schwartz: divide rather than multiply;
		   TBB: but watch out for /0! */
		double as = sin (atan2 (dy, dx));
		if (as != 0) {
			wid = thick / as;
		} else {
			wid = 1;
		}
		if (wid == 0)
			wid = 1;

		d = 2 * dx - dy;
		incr1 = 2 * dx;
		incr2 = 2 * (dx - dy);
		if (y1 > y2) {
			y = y2;
			x = x2;
			yend = y1;
			xdirflag = (-1);
		} else {
			y = y1;
			x = x1;
			yend = y2;
			xdirflag = 1;
		}

		/* Set up line thickness */
		wstart = x - wid / 2;
		for (w = wstart; w < wstart + wid; w++)
			gdImageSetPixel (im, w, y, color);

		if (((x2 - x1) * xdirflag) > 0) {
			while (y < yend) {
				y++;
				if (d < 0) {
					d += incr1;
				} else {
					x++;
					d += incr2;
				}
				wstart = x - wid / 2;
				for (w = wstart; w < wstart + wid; w++)
					gdImageSetPixel (im, w, y, color);
			}
		} else {
			while (y < yend) {
				y++;
				if (d < 0) {
					d += incr1;
				} else {
					x--;
					d += incr2;
				}
				wstart = x - wid / 2;
				for (w = wstart; w < wstart + wid; w++)
					gdImageSetPixel (im, w, y, color);
			}
		}
	}

}